

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void * arena_malloc_hard(tsdn_t *tsdn,arena_t *arena,size_t size,szind_t ind,_Bool zero)

{
  extent_t *slab;
  arena_t *paVar1;
  bin_t *bin;
  void *pvVar2;
  ticker_t *ptVar3;
  size_t __n;
  int iVar4;
  uint local_3c;
  size_t local_38;
  
  if (tsdn == (tsdn_t *)0x0) {
LAB_0010fc21:
    if (arena == (arena_t *)0x0) {
      return (void *)0x0;
    }
  }
  else if (arena == (arena_t *)0x0) {
    if ((size < oversize_threshold) ||
       ((paVar1 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena,
        paVar1 != (arena_t *)0x0 && (manual_arena_base <= paVar1->base->ind)))) {
      arena = arena_choose(&tsdn->tsd,(arena_t *)0x0);
    }
    else {
      arena = arena_choose_huge(&tsdn->tsd);
    }
    goto LAB_0010fc21;
  }
  local_38 = sz_index2size_tab[ind];
  if (0x3800 < size) {
    pvVar2 = large_malloc(tsdn,arena,local_38,zero);
    return pvVar2;
  }
  bin = arena_bin_choose_lock(tsdn,arena,ind,&local_3c);
  slab = bin->slabcur;
  if ((slab == (extent_t *)0x0) || ((slab->e_bits & 0xffc000000) == 0)) {
    pvVar2 = arena_bin_malloc_hard(tsdn,arena,bin,ind,local_3c);
  }
  else {
    pvVar2 = arena_slab_reg_alloc(slab,bin_infos + ind);
  }
  if (pvVar2 == (void *)0x0) {
    (bin->lock).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40));
    return (void *)0x0;
  }
  (bin->stats).nmalloc = (bin->stats).nmalloc + 1;
  (bin->stats).nrequests = (bin->stats).nrequests + 1;
  (bin->stats).curregs = (bin->stats).curregs + 1;
  (bin->lock).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40));
  if (zero) {
LAB_0010fcda:
    iVar4 = 0;
    __n = local_38;
  }
  else {
    if (opt_junk_alloc != true) {
      if (opt_zero != true) goto LAB_0010fd1a;
      goto LAB_0010fcda;
    }
    __n = bin_infos[ind].reg_size;
    iVar4 = 0xa5;
  }
  memset(pvVar2,iVar4,__n);
LAB_0010fd1a:
  if (((tsdn != (tsdn_t *)0x0) &&
      (ptVar3 = decay_ticker_get(&tsdn->tsd,arena->base->ind), ptVar3 != (ticker_t *)0x0)) &&
     (iVar4 = ptVar3->tick, ptVar3->tick = iVar4 + -1, iVar4 < 1)) {
    ptVar3->tick = ptVar3->nticks;
    arena_decay(tsdn,arena,false,false);
  }
  return pvVar2;
}

Assistant:

void *
arena_malloc_hard(tsdn_t *tsdn, arena_t *arena, size_t size, szind_t ind,
    bool zero) {
	assert(!tsdn_null(tsdn) || arena != NULL);

	if (likely(!tsdn_null(tsdn))) {
		arena = arena_choose_maybe_huge(tsdn_tsd(tsdn), arena, size);
	}
	if (unlikely(arena == NULL)) {
		return NULL;
	}

	if (likely(size <= SC_SMALL_MAXCLASS)) {
		return arena_malloc_small(tsdn, arena, ind, zero);
	}
	return large_malloc(tsdn, arena, sz_index2size(ind), zero);
}